

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
SetInstance::op_size
          (string *__return_storage_ptr__,SetInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  undefined8 *puVar1;
  IntegerInstance local_70;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    IntegerInstance::IntegerInstance
              (&local_70,(int)(this->_value)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::to_string(__return_storage_ptr__,local_70._value);
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_70);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}